

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::textureDefinition::setupSampler
          (textureDefinition *this,GLuint texture_unit,GLchar *sampler_name_p,GLuint program_id,
          bool is_shadow)

{
  GLint GVar1;
  GLenum GVar2;
  InternalError *this_00;
  
  if ((this->m_gl != (Functions *)0x0) && (this->m_texture_object_id != 0xffffffff)) {
    GVar1 = (*this->m_gl->getUniformLocation)(program_id,sampler_name_p);
    if (GVar1 != -1) {
      GVar2 = (*this->m_gl->getError)();
      if (GVar2 == 0) {
        (*this->m_gl->activeTexture)(texture_unit + 0x84c0);
        GVar2 = (*this->m_gl->getError)();
        glu::checkError(GVar2,"Failed to activate texture unit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                        ,0x1396);
        (*this->m_gl->bindTexture)(0x9009,this->m_texture_object_id);
        GVar2 = (*this->m_gl->getError)();
        glu::checkError(GVar2,"Failed to bind texture to GL_TEXTURE_CUBE_MAP_ARRAY_EXT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                        ,0x1399);
        if (is_shadow) {
          (*this->m_gl->texParameteri)(0x9009,0x884c,0x884e);
          (*this->m_gl->texParameteri)(0x9009,0x884d,0x201);
        }
        (*this->m_gl->uniform1i)(GVar1,texture_unit);
        GVar2 = (*this->m_gl->getError)();
        glu::checkError(GVar2,"Failed to set sampler uniform",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                        ,0x13a2);
        return;
      }
    }
    return;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,"Not initialized textureDefinition",fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
             ,0x138b);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArraySamplingTest::textureDefinition::setupSampler(glw::GLuint		 texture_unit,
																	  const glw::GLchar* sampler_name_p,
																	  glw::GLuint program_id, bool is_shadow)
{
	if ((0 == m_gl) || (m_invalid_texture_object_id == m_texture_object_id))
	{
		throw tcu::InternalError("Not initialized textureDefinition", "", __FILE__, __LINE__);
	}

	glw::GLint sampler_location = m_gl->getUniformLocation(program_id, sampler_name_p);
	if ((m_invalid_uniform_location == (glw::GLuint)sampler_location) || (GL_NO_ERROR != m_gl->getError()))
	{
		//throw tcu::InternalError("Failed to get sampler location", sampler_name_p, __FILE__, __LINE__);
		return;
	}

	m_gl->activeTexture(GL_TEXTURE0 + texture_unit);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to activate texture unit");

	m_gl->bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_texture_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to bind texture to GL_TEXTURE_CUBE_MAP_ARRAY_EXT");

	if (true == is_shadow)
	{
		m_gl->texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_REF_TO_TEXTURE);
		m_gl->texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_COMPARE_FUNC, GL_LESS);
	}

	m_gl->uniform1i(sampler_location, texture_unit);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to set sampler uniform");
}